

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

void xmlSchemaAugmentIDC(void *payload,void *data,xmlChar *name)

{
  undefined8 *puVar1;
  undefined1 auVar2 [16];
  
  auVar2 = (undefined1  [16])(*xmlMalloc)(0x18);
  puVar1 = auVar2._0_8_;
  if (puVar1 != (undefined8 *)0x0) {
    *(undefined4 *)(puVar1 + 2) = 0xffffffff;
    puVar1[1] = payload;
    *puVar1 = *(undefined8 *)((long)data + 200);
    *(undefined8 **)((long)data + 200) = puVar1;
    if ((*(int *)((long)data + 0x140) == 0) && (*payload == 0x18)) {
      *(undefined4 *)((long)data + 0x140) = 1;
    }
    return;
  }
  xmlSchemaVErrMemory((xmlSchemaValidCtxtPtr)data,
                      "xmlSchemaAugmentIDC: allocating an augmented IDC definition",auVar2._8_8_);
  return;
}

Assistant:

static void
xmlSchemaAugmentIDC(void *payload, void *data,
                    const xmlChar *name ATTRIBUTE_UNUSED)
{
    xmlSchemaIDCPtr idcDef = (xmlSchemaIDCPtr) payload;
    xmlSchemaValidCtxtPtr vctxt = (xmlSchemaValidCtxtPtr) data;
    xmlSchemaIDCAugPtr aidc;

    aidc = (xmlSchemaIDCAugPtr) xmlMalloc(sizeof(xmlSchemaIDCAug));
    if (aidc == NULL) {
	xmlSchemaVErrMemory(vctxt,
	    "xmlSchemaAugmentIDC: allocating an augmented IDC definition",
	    NULL);
	return;
    }
    aidc->keyrefDepth = -1;
    aidc->def = idcDef;
    aidc->next = NULL;
    if (vctxt->aidcs == NULL)
	vctxt->aidcs = aidc;
    else {
	aidc->next = vctxt->aidcs;
	vctxt->aidcs = aidc;
    }
    /*
    * Save if we have keyrefs at all.
    */
    if ((vctxt->hasKeyrefs == 0) &&
	(idcDef->type == XML_SCHEMA_TYPE_IDC_KEYREF))
	vctxt->hasKeyrefs = 1;
}